

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

pair<cmFileSet_*,_bool> __thiscall
cmTarget::GetOrCreateFileSet(cmTarget *this,string *name,string *type,cmFileSetVisibility vis)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  size_type __rlen;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_bool>
  pVar7;
  cmListFileBacktrace cVar8;
  pair<cmFileSet_*,_bool> pVar9;
  cmListFileBacktrace bt;
  string local_1b8;
  string local_198;
  cmListFileBacktrace local_178;
  cmListFileBacktrace local_168;
  cmListFileBacktrace local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>
  local_148;
  cmFileSet local_a8;
  undefined7 uVar6;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar2,pcVar2 + name->_M_string_length);
  pcVar2 = (type->_M_dataplus)._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar2,pcVar2 + type->_M_string_length);
  cmFileSet::cmFileSet(&local_a8,&local_1b8,&local_198,vis);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>::
  pair<cmFileSet,_true>(&local_148,name,&local_a8);
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFileSet>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFileSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmFileSet>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFileSet>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFileSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
                      *)&(_Var1._M_head_impl)->FileSets,&local_148);
  pVar9.second = pVar7.second;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_148.second.FileEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_148.second.DirectoryEntries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.second.Type._M_dataplus._M_p != &local_148.second.Type.field_2) {
    operator_delete(local_148.second.Type._M_dataplus._M_p,
                    local_148.second.Type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.second.Name._M_dataplus._M_p != &local_148.second.Name.field_2) {
    operator_delete(local_148.second.Name._M_dataplus._M_p,
                    local_148.second.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
    operator_delete(local_148.first._M_dataplus._M_p,
                    local_148.first.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_a8.FileEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_a8.DirectoryEntries);
  uVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Type._M_dataplus._M_p != &local_a8.Type.field_2) {
    operator_delete(local_a8.Type._M_dataplus._M_p,local_a8.Type.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Name._M_dataplus._M_p != &local_a8.Name.field_2) {
    operator_delete(local_a8.Name._M_dataplus._M_p,local_a8.Name.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_RDX_03;
  }
  uVar6 = (undefined7)((ulong)uVar4 >> 8);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_002f22a2;
  cVar8 = cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  _Var5._M_pi = cVar8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  pcVar2 = (type->_M_dataplus)._M_p;
  __n = type->_M_string_length;
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (__n == *(size_t *)&((_Var1._M_head_impl)->HeadersFileSets).TypeName) {
    if (__n != 0) {
      iVar3 = bcmp(pcVar2,*(char **)((long)&(_Var1._M_head_impl)->HeadersFileSets + 8),__n);
      _Var5._M_pi = extraout_RDX_04;
      if (iVar3 != 0) goto LAB_002f2180;
    }
    local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_148.first._M_dataplus._M_p;
    local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.first._M_string_length;
    local_148.first._M_dataplus._M_p = (pointer)0x0;
    local_148.first._M_string_length = 0;
    anon_unknown.dwarf_d1bafb::FileSetType::AddFileSet
              (&(_Var1._M_head_impl)->HeadersFileSets,name,vis,&local_158);
    _Var5._M_pi = extraout_RDX_08;
    this_00._M_pi =
         local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
LAB_002f2282:
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      _Var5._M_pi = extraout_RDX_10;
    }
  }
  else {
LAB_002f2180:
    if (__n == *(size_t *)&((_Var1._M_head_impl)->CxxModulesFileSets).TypeName) {
      if (__n != 0) {
        iVar3 = bcmp(pcVar2,*(char **)((long)&(_Var1._M_head_impl)->CxxModulesFileSets + 8),__n);
        _Var5._M_pi = extraout_RDX_05;
        if (iVar3 != 0) goto LAB_002f21ae;
      }
      local_168.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_148.first._M_dataplus._M_p;
      local_168.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.first._M_string_length;
      local_148.first._M_dataplus._M_p = (pointer)0x0;
      local_148.first._M_string_length = 0;
      anon_unknown.dwarf_d1bafb::FileSetType::AddFileSet
                (&(_Var1._M_head_impl)->CxxModulesFileSets,name,vis,&local_168);
      _Var5._M_pi = extraout_RDX_09;
      this_00._M_pi =
           local_168.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      goto LAB_002f2282;
    }
LAB_002f21ae:
    if (__n == *(size_t *)&((_Var1._M_head_impl)->CxxModuleHeadersFileSets).TypeName) {
      if (__n != 0) {
        iVar3 = bcmp(pcVar2,*(char **)((long)&(_Var1._M_head_impl)->CxxModuleHeadersFileSets + 8),
                     __n);
        _Var5._M_pi = extraout_RDX_06;
        if (iVar3 != 0) goto LAB_002f228c;
      }
      local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_148.first._M_dataplus._M_p;
      local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.first._M_string_length;
      local_148.first._M_dataplus._M_p = (pointer)0x0;
      local_148.first._M_string_length = 0;
      anon_unknown.dwarf_d1bafb::FileSetType::AddFileSet
                (&(_Var1._M_head_impl)->CxxModuleHeadersFileSets,name,vis,&local_178);
      _Var5._M_pi = extraout_RDX_07;
      this_00._M_pi =
           local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      goto LAB_002f2282;
    }
  }
LAB_002f228c:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.first._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.first._M_string_length);
    _Var5._M_pi = extraout_RDX_11;
  }
  uVar6 = (undefined7)((ulong)_Var5._M_pi >> 8);
LAB_002f22a2:
  pVar9._9_7_ = uVar6;
  pVar9.first = (cmFileSet *)(pVar7.first._M_node._M_node + 2);
  return pVar9;
}

Assistant:

std::pair<cmFileSet*, bool> cmTarget::GetOrCreateFileSet(
  const std::string& name, const std::string& type, cmFileSetVisibility vis)
{
  auto result = this->impl->FileSets.emplace(
    std::make_pair(name, cmFileSet(name, type, vis)));
  if (result.second) {
    auto bt = this->impl->Makefile->GetBacktrace();
    if (type == this->impl->HeadersFileSets.TypeName) {
      this->impl->HeadersFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModulesFileSets.TypeName) {
      this->impl->CxxModulesFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModuleHeadersFileSets.TypeName) {
      this->impl->CxxModuleHeadersFileSets.AddFileSet(name, vis,
                                                      std::move(bt));
    }
  }
  return std::make_pair(&result.first->second, result.second);
}